

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-read-bytes.h
# Opt level: O3

int read_bytes(coda_product *product,int64_t byte_offset,int64_t length,void *dst)

{
  ssize_t sVar1;
  int *piVar2;
  char *pcVar3;
  char *message;
  int err;
  char offset_str [21];
  char size_str [21];
  char offset_str_1 [21];
  char acStack_78 [32];
  char local_58 [32];
  char local_38 [24];
  
  pcVar3 = acStack_78;
  if (product->mem_ptr == (uint8_t *)0x0) {
    if (coda_format_binary < product->format) {
      __assert_fail("product->format == coda_format_ascii || product->format == coda_format_binary",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-read-bytes.h"
                    ,100,"int read_bytes(coda_product *, int64_t, int64_t, void *)");
    }
    if (-1 < byte_offset) {
      if ((ulong)(length + byte_offset) <= (ulong)product->file_size) {
        sVar1 = pread(*(int *)((long)&product[1].filename + 4),dst,length,byte_offset);
        if (-1 < sVar1) {
          return 0;
        }
        piVar2 = __errno_location();
        pcVar3 = strerror(*piVar2);
        message = "could not read from file (%s)";
        err = -0x16;
        goto LAB_0016937d;
      }
      goto LAB_001692f6;
    }
  }
  else {
    if (-1 < byte_offset) {
      if ((ulong)(length + byte_offset) <= (ulong)product->mem_size) {
        memcpy(dst,product->mem_ptr + byte_offset,length);
        return 0;
      }
      if (coda_format_binary < product->format) {
        coda_str64(length,acStack_78);
        coda_str64(byte_offset,local_38);
        coda_str64(product->mem_size,local_58);
        coda_set_error(-0x12d,"trying to read %s bytes at position %s in block of size %s",
                       acStack_78,local_38,local_58);
        return -1;
      }
LAB_001692f6:
      pcVar3 = "trying to read beyond the end of the file";
      goto LAB_0016930d;
    }
    if (coda_format_binary < product->format) {
      coda_str64(byte_offset,acStack_78);
      message = "trying to read bytes using invalid offset %s";
      err = -0x12d;
LAB_0016937d:
      coda_set_error(err,message,pcVar3);
      return -1;
    }
  }
  pcVar3 = "trying to read before the start of the file";
LAB_0016930d:
  coda_set_error(-0x12d,pcVar3);
  return -1;
}

Assistant:

static int read_bytes(coda_product *product, int64_t byte_offset, int64_t length, void *dst)
{
    if (product->mem_ptr != NULL)
    {
        if (byte_offset < 0)
        {
            if (product->format == coda_format_ascii || product->format == coda_format_binary)
            {
                coda_set_error(CODA_ERROR_OUT_OF_BOUNDS_READ, "trying to read before the start of the file");
                return -1;
            }
            else
            {
                char offset_str[21];

                coda_str64(byte_offset, offset_str);
                coda_set_error(CODA_ERROR_OUT_OF_BOUNDS_READ, "trying to read bytes using invalid offset %s",
                               offset_str);
                return -1;
            }
        }
        if (((uint64_t)byte_offset + length) > ((uint64_t)product->mem_size))
        {
            if (product->format == coda_format_ascii || product->format == coda_format_binary)
            {
                coda_set_error(CODA_ERROR_OUT_OF_BOUNDS_READ, "trying to read beyond the end of the file");
                return -1;
            }
            else
            {
                char accessed_str[21];
                char offset_str[21];
                char size_str[21];

                coda_str64(length, accessed_str);
                coda_str64(byte_offset, offset_str);
                coda_str64(product->mem_size, size_str);
                coda_set_error(CODA_ERROR_OUT_OF_BOUNDS_READ, "trying to read %s bytes at position %s in block of "
                               "size %s", accessed_str, offset_str, size_str);
                return -1;
            }
        }
        memcpy(dst, product->mem_ptr + byte_offset, (size_t)length);
    }
    else
    {
        assert(product->format == coda_format_ascii || product->format == coda_format_binary);
        if (byte_offset < 0)
        {
            coda_set_error(CODA_ERROR_OUT_OF_BOUNDS_READ, "trying to read before the start of the file");
            return -1;
        }
        if (((uint64_t)byte_offset + length) > ((uint64_t)product->file_size))
        {
            coda_set_error(CODA_ERROR_OUT_OF_BOUNDS_READ, "trying to read beyond the end of the file");
            return -1;
        }
#if HAVE_PREAD
        if (pread(((coda_bin_product *)product)->fd, dst, (size_t)length, (off_t)byte_offset) < 0)
        {
            coda_set_error(CODA_ERROR_FILE_READ, "could not read from file (%s)", strerror(errno));
            return -1;
        }
#else
        if (lseek(((coda_bin_product *)product)->fd, (off_t)byte_offset, SEEK_SET) < 0)
        {
            char byte_offset_str[21];

            coda_str64(byte_offset, byte_offset_str);
            coda_set_error(CODA_ERROR_FILE_READ, "could not move to byte position %s (%s)", byte_offset_str,
                           strerror(errno));
            return -1;
        }
        if (read(((coda_bin_product *)product)->fd, dst, (size_t)length) < 0)
        {
            coda_set_error(CODA_ERROR_FILE_READ, "could not read from file (%s)", strerror(errno));
            return -1;
        }
#endif
    }

    return 0;
}